

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model_test.cc
# Opt level: O2

void __thiscall
gtest_suite_FlatBlockEstimatorTest_::FindFlatBlocks<BitDepthParams<unsigned_short,_12,_true>_>::
TestBody(FindFlatBlocks<BitDepthParams<unsigned_short,_12,_true>_> *this)

{
  VecType *this_00;
  pointer puVar1;
  int y_1;
  pointer puVar2;
  int x;
  ulong uVar3;
  long lVar4;
  SEARCH_METHODS *pSVar5;
  int y;
  ulong uVar6;
  ACMRandom *random;
  long lVar7;
  bool bVar8;
  double dVar9;
  double dVar10;
  AssertHelper local_a0;
  AssertHelper local_98;
  AssertionResult gtest_ar_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> flat_blocks;
  aom_flat_block_finder_t flat_block_finder;
  
  gtest_ar_1.success_ = true;
  gtest_ar_1._1_3_ = 0;
  local_a0.data_._0_4_ = aom_flat_block_finder_init(&flat_block_finder,0x20,0xc,1);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&flat_blocks,"1",
             "aom_flat_block_finder_init(&flat_block_finder, kBlockSize, this->kBitDepth, this->kUseHighBD)"
             ,(int *)&gtest_ar_1,(int *)&local_a0);
  if ((char)flat_blocks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (flat_blocks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pSVar5 = "";
    }
    else {
      pSVar5 = *(SEARCH_METHODS **)
                flat_blocks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
               ,0x1b5,(char *)pSVar5);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if ((long *)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_) + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&flat_blocks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&flat_blocks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
    this_00 = &(this->super_FlatBlockEstimatorTest<BitDepthParams<unsigned_short,_12,_true>_>).data_
    ;
    flat_blocks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = 0x80;
    flat_blocks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._1_1_ = 0;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
              (this_00,0x2000,(value_type_conflict4 *)&flat_blocks);
    gtest_ar_1._0_4_ = gtest_ar_1._0_4_ & 0xffffff00;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&flat_blocks,8,&gtest_ar_1.success_,(allocator_type *)&local_a0);
    random = &(this->super_FlatBlockEstimatorTest<BitDepthParams<unsigned_short,_12,_true>_>).
              random_;
    lVar7 = 0;
    for (uVar6 = 0; uVar6 != 0x20; uVar6 = uVar6 + 1) {
      for (uVar3 = 0; uVar3 != 0x20; uVar3 = uVar3 + 1) {
        *(undefined2 *)
         ((long)(this_00->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                _M_impl.super__Vector_impl_data._M_start + uVar3 * 2 + lVar7) = 0x800;
        dVar9 = anon_unknown.dwarf_73c935::randn(random,5.0);
        puVar1 = (this_00->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        *(short *)((long)puVar1 + uVar3 * 2 + lVar7 + 0x40) =
             (short)(((int)(dVar9 + 128.0) & 0xffU) << 4);
        bVar8 = ((int)uVar6 + (int)uVar3 & 1U) == 0;
        *(ushort *)((long)puVar1 + uVar3 * 2 + lVar7 + 0x80) =
             ((ushort)bVar8 * 4 + -2) * 0x10 + 0x800;
        *(ushort *)((long)puVar1 + uVar3 * 2 + lVar7 + 0xc0) =
             ((((ushort)uVar6 | 0x40) * 2 - (short)(uVar3 >> 1)) + (ushort)bVar8 * 4 + -2) * 0x10;
        dVar9 = anon_unknown.dwarf_73c935::randn(random,1.0);
        *(short *)((long)(this_00->
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                         _M_impl.super__Vector_impl_data._M_start + uVar3 * 2 + lVar7 + 0x100) =
             (short)(((int)(dVar9 + (double)(int)uVar3 + 128.0) & 0xffU) << 4);
        dVar9 = anon_unknown.dwarf_73c935::randn(random,2.0);
        *(short *)((long)(this_00->
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                         _M_impl.super__Vector_impl_data._M_start + uVar3 * 2 + lVar7 + 0x140) =
             (short)(((int)(dVar9 + (double)(int)uVar6 + 128.0) & 0xffU) << 4);
        dVar9 = anon_unknown.dwarf_73c935::randn(random,1.0);
        dVar10 = 64.0;
        if (uVar3 < 0x11) {
          dVar10 = 0.0;
        }
        *(short *)((long)(this_00->
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                         _M_impl.super__Vector_impl_data._M_start + uVar3 * 2 + lVar7 + 0x180) =
             (short)(((int)(dVar9 + dVar10 + 128.0) & 0xffU) << 4);
        dVar9 = anon_unknown.dwarf_73c935::randn(random,1.0);
        *(short *)((long)(this_00->
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                         _M_impl.super__Vector_impl_data._M_start + uVar3 * 2 + lVar7 + 0x1c0) =
             (short)(((int)(dVar9 + (double)(int)((uint)((((uint)(uVar3 >> 2) & 0x3fffffff) +
                                                          ((uint)(uVar6 >> 2) & 0x3fffffff) & 1) ==
                                                        0) * 0x20 + -0x10) + 128.0) & 0xffU) << 4);
      }
      lVar7 = lVar7 + 0x200;
    }
    local_a0.data_._0_4_ = 4;
    local_98.data_._0_4_ =
         aom_flat_block_finder_run
                   (&flat_block_finder,
                    (uint8_t *)
                    (this_00->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                    _M_impl.super__Vector_impl_data._M_start,0x100,0x20,0x100,
                    (uint8_t *)
                    CONCAT62(flat_blocks.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._2_6_,
                             CONCAT11(flat_blocks.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                      (char)flat_blocks.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start)));
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar_1,"4",
               "aom_flat_block_finder_run(&flat_block_finder, (uint8_t *)&this->data_[0], w, h, stride, &flat_blocks[0])"
               ,(int *)&local_a0,(int *)&local_98);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_a0);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pSVar5 = "";
      }
      else {
        pSVar5 = *(SEARCH_METHODS **)
                  gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                 ,0x1e6,(char *)pSVar5);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if ((long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_1.message_);
    local_a0.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,unsigned_char>
              ((internal *)&gtest_ar_1,"0","flat_blocks[0]",(int *)&local_a0,
               (uchar *)CONCAT62(flat_blocks.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._2_6_,
                                 CONCAT11(flat_blocks.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                          (char)flat_blocks.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start)));
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_a0);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pSVar5 = "";
      }
      else {
        pSVar5 = *(SEARCH_METHODS **)
                  gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                 ,0x1e9,(char *)pSVar5);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if ((long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_1.message_);
    local_a0.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,unsigned_char>
              ((internal *)&gtest_ar_1,"0","flat_blocks[1]",(int *)&local_a0,
               (uchar *)(CONCAT62(flat_blocks.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._2_6_,
                                  CONCAT11(flat_blocks.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                           (char)flat_blocks.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)) + 1));
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_a0);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pSVar5 = "";
      }
      else {
        pSVar5 = *(SEARCH_METHODS **)
                  gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                 ,0x1ea,(char *)pSVar5);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if ((long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_1.message_);
    local_a0.data_._0_4_ = 0xff;
    testing::internal::CmpHelperEQ<int,unsigned_char>
              ((internal *)&gtest_ar_1,"255","flat_blocks[2]",(int *)&local_a0,
               (uchar *)(CONCAT62(flat_blocks.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._2_6_,
                                  CONCAT11(flat_blocks.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                           (char)flat_blocks.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)) + 2));
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_a0);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pSVar5 = "";
      }
      else {
        pSVar5 = *(SEARCH_METHODS **)
                  gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                 ,0x1ed,(char *)pSVar5);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if ((long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_1.message_);
    local_a0.data_._0_4_ = 0xff;
    testing::internal::CmpHelperEQ<int,unsigned_char>
              ((internal *)&gtest_ar_1,"255","flat_blocks[3]",(int *)&local_a0,
               (uchar *)(CONCAT62(flat_blocks.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._2_6_,
                                  CONCAT11(flat_blocks.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                           (char)flat_blocks.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)) + 3));
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_a0);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pSVar5 = "";
      }
      else {
        pSVar5 = *(SEARCH_METHODS **)
                  gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                 ,0x1ee,(char *)pSVar5);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if ((long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_1.message_);
    local_a0.data_._0_4_ = 0xff;
    testing::internal::CmpHelperEQ<int,unsigned_char>
              ((internal *)&gtest_ar_1,"255","flat_blocks[4]",(int *)&local_a0,
               (uchar *)(CONCAT62(flat_blocks.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._2_6_,
                                  CONCAT11(flat_blocks.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                           (char)flat_blocks.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)) + 4));
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_a0);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pSVar5 = "";
      }
      else {
        pSVar5 = *(SEARCH_METHODS **)
                  gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                 ,0x1ef,(char *)pSVar5);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if ((long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_1.message_);
    local_a0.data_._0_4_ = 0xff;
    testing::internal::CmpHelperEQ<int,unsigned_char>
              ((internal *)&gtest_ar_1,"255","flat_blocks[5]",(int *)&local_a0,
               (uchar *)(CONCAT62(flat_blocks.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._2_6_,
                                  CONCAT11(flat_blocks.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                           (char)flat_blocks.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)) + 5));
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_a0);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pSVar5 = "";
      }
      else {
        pSVar5 = *(SEARCH_METHODS **)
                  gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                 ,0x1f0,(char *)pSVar5);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if ((long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_1.message_);
    local_a0.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,unsigned_char>
              ((internal *)&gtest_ar_1,"0","flat_blocks[6]",(int *)&local_a0,
               (uchar *)(CONCAT62(flat_blocks.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._2_6_,
                                  CONCAT11(flat_blocks.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                           (char)flat_blocks.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)) + 6));
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_a0);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pSVar5 = "";
      }
      else {
        pSVar5 = *(SEARCH_METHODS **)
                  gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                 ,499,(char *)pSVar5);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if ((long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_1.message_);
    local_a0.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,unsigned_char>
              ((internal *)&gtest_ar_1,"0","flat_blocks[7]",(int *)&local_a0,
               (uchar *)(CONCAT62(flat_blocks.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._2_6_,
                                  CONCAT11(flat_blocks.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                           (char)flat_blocks.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)) + 7));
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_a0);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pSVar5 = "";
      }
      else {
        pSVar5 = *(SEARCH_METHODS **)
                  gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                 ,500,(char *)pSVar5);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if ((long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_1.message_);
    puVar1 = (this_00->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = puVar1;
    for (lVar7 = 0; lVar7 != 0x20; lVar7 = lVar7 + 1) {
      for (lVar4 = 0; lVar4 != 0x100; lVar4 = lVar4 + 1) {
        puVar2[lVar4] =
             (puVar1[(ulong)((uint)lVar4 & 0x1f | (int)lVar7 << 8) + 0x20] + puVar2[lVar4]) - 0x800;
      }
      puVar2 = puVar2 + 0x100;
    }
    local_a0.data_._0_4_ = 1;
    local_98.data_._0_4_ =
         aom_flat_block_finder_run
                   (&flat_block_finder,(uint8_t *)puVar1,0x100,0x20,0x100,
                    (uint8_t *)
                    CONCAT62(flat_blocks.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._2_6_,
                             CONCAT11(flat_blocks.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                      (char)flat_blocks.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start)));
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar_1,"1",
               "aom_flat_block_finder_run(&flat_block_finder, (uint8_t *)&this->data_[0], w, h, stride, &flat_blocks[0])"
               ,(int *)&local_a0,(int *)&local_98);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_a0);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pSVar5 = "";
      }
      else {
        pSVar5 = *(SEARCH_METHODS **)
                  gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                 ,0x202,(char *)pSVar5);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if ((long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_1.message_);
    local_a0.data_._0_4_ = 1;
    testing::internal::CmpHelperEQ<int,unsigned_char>
              ((internal *)&gtest_ar_1,"1","flat_blocks[0]",(int *)&local_a0,
               (uchar *)CONCAT62(flat_blocks.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._2_6_,
                                 CONCAT11(flat_blocks.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                          (char)flat_blocks.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start)));
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_a0);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pSVar5 = "";
      }
      else {
        pSVar5 = *(SEARCH_METHODS **)
                  gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                 ,0x203,(char *)pSVar5);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if ((long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_1.message_);
    local_a0.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,unsigned_char>
              ((internal *)&gtest_ar_1,"0","flat_blocks[1]",(int *)&local_a0,
               (uchar *)(CONCAT62(flat_blocks.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._2_6_,
                                  CONCAT11(flat_blocks.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                           (char)flat_blocks.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)) + 1));
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_a0);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pSVar5 = "";
      }
      else {
        pSVar5 = *(SEARCH_METHODS **)
                  gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                 ,0x204,(char *)pSVar5);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if ((long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_1.message_);
    local_a0.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,unsigned_char>
              ((internal *)&gtest_ar_1,"0","flat_blocks[2]",(int *)&local_a0,
               (uchar *)(CONCAT62(flat_blocks.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._2_6_,
                                  CONCAT11(flat_blocks.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                           (char)flat_blocks.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)) + 2));
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_a0);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pSVar5 = "";
      }
      else {
        pSVar5 = *(SEARCH_METHODS **)
                  gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                 ,0x205,(char *)pSVar5);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if ((long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_1.message_);
    local_a0.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,unsigned_char>
              ((internal *)&gtest_ar_1,"0","flat_blocks[3]",(int *)&local_a0,
               (uchar *)(CONCAT62(flat_blocks.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._2_6_,
                                  CONCAT11(flat_blocks.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                           (char)flat_blocks.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)) + 3));
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_a0);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pSVar5 = "";
      }
      else {
        pSVar5 = *(SEARCH_METHODS **)
                  gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                 ,0x206,(char *)pSVar5);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if ((long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_1.message_);
    local_a0.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,unsigned_char>
              ((internal *)&gtest_ar_1,"0","flat_blocks[4]",(int *)&local_a0,
               (uchar *)(CONCAT62(flat_blocks.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._2_6_,
                                  CONCAT11(flat_blocks.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                           (char)flat_blocks.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)) + 4));
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_a0);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pSVar5 = "";
      }
      else {
        pSVar5 = *(SEARCH_METHODS **)
                  gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                 ,0x207,(char *)pSVar5);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if ((long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_1.message_);
    local_a0.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,unsigned_char>
              ((internal *)&gtest_ar_1,"0","flat_blocks[5]",(int *)&local_a0,
               (uchar *)(CONCAT62(flat_blocks.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._2_6_,
                                  CONCAT11(flat_blocks.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                           (char)flat_blocks.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)) + 5));
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_a0);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pSVar5 = "";
      }
      else {
        pSVar5 = *(SEARCH_METHODS **)
                  gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                 ,0x208,(char *)pSVar5);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if ((long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_1.message_);
    local_a0.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,unsigned_char>
              ((internal *)&gtest_ar_1,"0","flat_blocks[6]",(int *)&local_a0,
               (uchar *)(CONCAT62(flat_blocks.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._2_6_,
                                  CONCAT11(flat_blocks.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                           (char)flat_blocks.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)) + 6));
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_a0);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pSVar5 = "";
      }
      else {
        pSVar5 = *(SEARCH_METHODS **)
                  gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                 ,0x209,(char *)pSVar5);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if ((long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_1.message_);
    local_a0.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,unsigned_char>
              ((internal *)&gtest_ar_1,"0","flat_blocks[7]",(int *)&local_a0,
               (uchar *)(CONCAT62(flat_blocks.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._2_6_,
                                  CONCAT11(flat_blocks.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                           (char)flat_blocks.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)) + 7));
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_a0);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pSVar5 = "";
      }
      else {
        pSVar5 = *(SEARCH_METHODS **)
                  gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                 ,0x20a,(char *)pSVar5);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if ((long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_1.message_);
    aom_flat_block_finder_free(&flat_block_finder);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&flat_blocks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  return;
}

Assistant:

TYPED_TEST_P(FlatBlockEstimatorTest, FindFlatBlocks) {
  const int kBlockSize = 32;
  aom_flat_block_finder_t flat_block_finder;
  ASSERT_EQ(1, aom_flat_block_finder_init(&flat_block_finder, kBlockSize,
                                          this->kBitDepth, this->kUseHighBD));

  const int num_blocks_w = 8;
  const int h = kBlockSize;
  const int w = kBlockSize * num_blocks_w;
  const int stride = w;
  this->data_.resize(h * stride, 128);
  std::vector<uint8_t> flat_blocks(num_blocks_w, 0);

  const int shift = this->kBitDepth - 8;
  for (int y = 0; y < kBlockSize; ++y) {
    for (int x = 0; x < kBlockSize; ++x) {
      // Block 0 (not flat): constant doesn't have enough variance to qualify
      this->data_[y * stride + x + 0 * kBlockSize] = 128 << shift;

      // Block 1 (not flat): too high of variance is hard to validate as flat
      this->data_[y * stride + x + 1 * kBlockSize] =
          ((uint8_t)(128 + randn(&this->random_, 5))) << shift;

      // Block 2 (flat): slight checkerboard added to constant
      const int check = (x % 2 + y % 2) % 2 ? -2 : 2;
      this->data_[y * stride + x + 2 * kBlockSize] = (128 + check) << shift;

      // Block 3 (flat): planar block with checkerboard pattern is also flat
      this->data_[y * stride + x + 3 * kBlockSize] =
          (y * 2 - x / 2 + 128 + check) << shift;

      // Block 4 (flat): gaussian random with standard deviation 1.
      this->data_[y * stride + x + 4 * kBlockSize] =
          ((uint8_t)(randn(&this->random_, 1) + x + 128.0)) << shift;

      // Block 5 (flat): gaussian random with standard deviation 2.
      this->data_[y * stride + x + 5 * kBlockSize] =
          ((uint8_t)(randn(&this->random_, 2) + y + 128.0)) << shift;

      // Block 6 (not flat): too high of directional gradient.
      const int strong_edge = x > kBlockSize / 2 ? 64 : 0;
      this->data_[y * stride + x + 6 * kBlockSize] =
          ((uint8_t)(randn(&this->random_, 1) + strong_edge + 128.0)) << shift;

      // Block 7 (not flat): too high gradient.
      const int big_check = ((x >> 2) % 2 + (y >> 2) % 2) % 2 ? -16 : 16;
      this->data_[y * stride + x + 7 * kBlockSize] =
          ((uint8_t)(randn(&this->random_, 1) + big_check + 128.0)) << shift;
    }
  }

  EXPECT_EQ(4, aom_flat_block_finder_run(&flat_block_finder,
                                         (uint8_t *)&this->data_[0], w, h,
                                         stride, &flat_blocks[0]));

  // First two blocks are not flat
  EXPECT_EQ(0, flat_blocks[0]);
  EXPECT_EQ(0, flat_blocks[1]);

  // Next 4 blocks are flat.
  EXPECT_EQ(255, flat_blocks[2]);
  EXPECT_EQ(255, flat_blocks[3]);
  EXPECT_EQ(255, flat_blocks[4]);
  EXPECT_EQ(255, flat_blocks[5]);

  // Last 2 are not flat by threshold
  EXPECT_EQ(0, flat_blocks[6]);
  EXPECT_EQ(0, flat_blocks[7]);

  // Add the noise from non-flat block 1 to every block.
  for (int y = 0; y < kBlockSize; ++y) {
    for (int x = 0; x < kBlockSize * num_blocks_w; ++x) {
      this->data_[y * stride + x] +=
          (this->data_[y * stride + x % kBlockSize + kBlockSize] -
           (128 << shift));
    }
  }
  // Now the scored selection will pick the one that is most likely flat (block
  // 0)
  EXPECT_EQ(1, aom_flat_block_finder_run(&flat_block_finder,
                                         (uint8_t *)&this->data_[0], w, h,
                                         stride, &flat_blocks[0]));
  EXPECT_EQ(1, flat_blocks[0]);
  EXPECT_EQ(0, flat_blocks[1]);
  EXPECT_EQ(0, flat_blocks[2]);
  EXPECT_EQ(0, flat_blocks[3]);
  EXPECT_EQ(0, flat_blocks[4]);
  EXPECT_EQ(0, flat_blocks[5]);
  EXPECT_EQ(0, flat_blocks[6]);
  EXPECT_EQ(0, flat_blocks[7]);

  aom_flat_block_finder_free(&flat_block_finder);
}